

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

size_t __thiscall Assimp::CFIReaderImpl::parseInt4(CFIReaderImpl *this)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  DeadlyImportError *this_00;
  byte *pbVar5;
  
  pbVar5 = this->dataP;
  pbVar1 = pbVar5 + 1;
  this->dataP = pbVar1;
  bVar2 = *pbVar5;
  uVar3 = (uint)bVar2;
  if ((bVar2 & 0x10) == 0) {
    sVar4 = (size_t)(uVar3 & 0xf);
  }
  else {
    if ((bVar2 & 0x1c) == 0x14) {
      if ((long)this->dataEnd - (long)pbVar1 < 2) goto LAB_0061355a;
      sVar4 = (size_t)((uint)pbVar5[1] * 0x100 + ((uint)pbVar5[2] | (uVar3 & 3) << 0x10) + 0x410);
      pbVar5 = pbVar5 + 3;
    }
    else {
      if ((bVar2 & 0x1c) == 0x10) {
        if (0 < (long)this->dataEnd - (long)pbVar1) {
          this->dataP = pbVar5 + 2;
          return (ulong)((uVar3 & 3) * 0x100 + (uint)pbVar5[1] + 0x10);
        }
LAB_0061355a:
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((((uVar3 & 0x1f) != 0x18) || ((long)this->dataEnd - (long)pbVar1 < 3)) || (0xf < *pbVar1))
      goto LAB_0061355a;
      sVar4 = (ulong)pbVar5[3] + (ulong)((uint)pbVar5[2] << 8 | (uint)*pbVar1 << 0x10) + 0x40410;
      pbVar5 = pbVar5 + 4;
    }
    this->dataP = pbVar5;
  }
  return sVar4;
}

Assistant:

size_t parseInt4() { // C.28
        uint8_t b = *dataP++;
        if (!(b & 0x10)) { // xxx0.... (C.28.2)
            return b & 0x0f;
        }
        else if ((b & 0x1c) == 0x10) { // xxx100.. ........ (C.28.3)
            if (dataEnd - dataP > 0) {
                return (((b & 0x03) << 8) | *dataP++) + 0x10;
            }
        }
        else if ((b & 0x1c) == 0x14) { // xxx101.. ........ ........ (C.28.4)
            if (dataEnd - dataP > 1) {
                size_t result = (((b & 0x03) << 16) | (dataP[0] << 8) | dataP[1]) + 0x410;
                dataP += 2;
                return result;
            }
        }
        else if ((b & 0x1f) == 0x18) { // xxx11000 0000.... ........ ........ (C.28.5)
            if ((dataEnd - dataP > 2) && !(dataP[0] & 0xf0)) {
                size_t result = (((dataP[0] & 0x0f) << 16) | (dataP[1] << 8) | dataP[2]) + 0x40410;
                dataP += 3;
                return result;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }